

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_struct<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  FieldBegin fb;
  string_view full_tag_00;
  StructBegin sb;
  string_view tag_00;
  string_view full_tag_01;
  bool bVar1;
  ToStringVisitor *in_RCX;
  char *in_RDX;
  char *in_RDI;
  ToStringVisitor *in_R8;
  ToStringVisitor *in_R9;
  string_view sVar2;
  int unaff_retaddr;
  string_view field_tag;
  string_view field_name;
  bool skip;
  string_view intro;
  undefined8 in_stack_fffffffffffffee8;
  char c;
  string_view *in_stack_fffffffffffffef0;
  string_view *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *pcVar3;
  ToStringVisitor *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  Range *in_stack_ffffffffffffff40;
  ToStringVisitor *in_stack_ffffffffffffff48;
  ToStringVisitor *local_b0;
  undefined8 in_stack_ffffffffffffff60;
  char *local_50;
  ToStringVisitor *local_48;
  char *local_40;
  Range *istream_00;
  ToStringVisitor *pTVar4;
  
  c = (char)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  string_view::remove_suffix((string_view *)&stack0xffffffffffffffe0,1);
  _local_40 = remove_prefix_before(in_stack_fffffffffffffef0,c);
  bVar1 = string_view::empty((string_view *)&stack0xffffffffffffffe0);
  local_50 = in_RDX;
  local_48 = in_RCX;
  if (bVar1) {
    full_tag_00._len = in_stack_ffffffffffffff20;
    full_tag_00._ptr = in_stack_ffffffffffffff18;
    sVar2._len = (size_t)in_stack_ffffffffffffff10;
    sVar2._ptr = in_stack_ffffffffffffff08;
    sVar2 = resolve_recursive_tag(full_tag_00,sVar2);
    local_50 = sVar2._ptr;
    local_48 = (ToStringVisitor *)sVar2._len;
  }
  string_view::remove_prefix((string_view *)&local_40,1);
  sb.name._len = (size_t)local_40;
  sb.name._ptr = (char *)in_stack_ffffffffffffff60;
  sb.tag._ptr = (char *)istream_00;
  sb.tag._len = (size_t)local_50;
  pTVar4 = local_48;
  bVar1 = binlog::ToStringVisitor::visit(in_stack_ffffffffffffff48,sb,in_stack_ffffffffffffff40);
  if (!bVar1) {
    while (bVar1 = string_view::empty((string_view *)&stack0xffffffffffffffe0),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      tag_pop_label(in_stack_ffffffffffffff00);
      sVar2 = tag_pop((string_view *)local_48);
      pcVar3 = sVar2._ptr;
      local_b0 = (ToStringVisitor *)sVar2._len;
      fb.name._len = (size_t)in_stack_ffffffffffffff08;
      fb.name._ptr = (char *)in_stack_ffffffffffffff00;
      fb.tag._ptr = (char *)in_stack_ffffffffffffff10;
      fb.tag._len = (size_t)in_stack_ffffffffffffff18;
      local_48 = local_b0;
      in_stack_ffffffffffffff18 = in_RDI;
      binlog::ToStringVisitor::visit(local_b0,fb);
      full_tag_01._len = (size_t)in_stack_ffffffffffffff18;
      full_tag_01._ptr = (char *)pTVar4;
      tag_00._len = (size_t)local_50;
      tag_00._ptr = (char *)in_R8;
      in_RDI = in_stack_ffffffffffffff18;
      visit_impl<binlog::ToStringVisitor,binlog::Range>
                (full_tag_01,tag_00,in_R9,istream_00,unaff_retaddr);
      binlog::ToStringVisitor::visit(in_R8);
      in_stack_ffffffffffffff08 = pcVar3;
      in_stack_ffffffffffffff10 = local_b0;
    }
    binlog::ToStringVisitor::visit(in_R8);
  }
  return;
}

Assistant:

void visit_struct(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_suffix(1); // drop }

  string_view intro = remove_prefix_before(tag, '`');

  if (tag.empty())
  {
    // perhaps a recursive struct?
    tag = resolve_recursive_tag(full_tag, intro);
  }

  intro.remove_prefix(1); // drop {

  const bool skip = visitor.visit(mserialize::Visitor::StructBegin{intro, tag}, istream);
  if (skip) { return; }

  while (! tag.empty())
  {
    const string_view field_name = tag_pop_label(tag);
    const string_view field_tag = tag_pop(tag);

    visitor.visit(mserialize::Visitor::FieldBegin{field_name, field_tag});

    visit_impl(full_tag, field_tag, visitor, istream, max_recursion);

    visitor.visit(mserialize::Visitor::FieldEnd{});
  }

  visitor.visit(mserialize::Visitor::StructEnd{});
}